

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

void __thiscall icu_63::CollationRuleParser::setErrorContext(CollationRuleParser *this)

{
  short sVar1;
  char16_t cVar2;
  int32_t iVar3;
  uint length;
  int start;
  UnicodeString *this_00;
  UParseError *pUVar4;
  int iVar5;
  
  pUVar4 = this->parseError;
  if (pUVar4 != (UParseError *)0x0) {
    iVar5 = this->ruleIndex;
    pUVar4->offset = iVar5;
    pUVar4->line = 0;
    start = 0;
    if (0xf < iVar5) {
      cVar2 = UnicodeString::doCharAt(this->rules,iVar5 + -0xf);
      start = iVar5 + -0xe;
      if ((cVar2 & 0xfc00U) != 0xdc00) {
        start = iVar5 + -0xf;
      }
      iVar5 = this->ruleIndex;
      pUVar4 = this->parseError;
    }
    UnicodeString::doExtract(this->rules,start,iVar5 - start,pUVar4->preContext,0);
    pUVar4 = this->parseError;
    pUVar4->preContext[iVar5 - start] = L'\0';
    this_00 = this->rules;
    sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar5 = this->ruleIndex;
    length = iVar3 - iVar5;
    if (0xf < (int)length) {
      cVar2 = UnicodeString::doCharAt(this_00,iVar5 + 0xe);
      length = (cVar2 & 0xfc00U) == 0xd800 ^ 0xf;
      this_00 = this->rules;
      pUVar4 = this->parseError;
      iVar5 = this->ruleIndex;
    }
    UnicodeString::doExtract(this_00,iVar5,length,pUVar4->postContext,0);
    this->parseError->postContext[(int)length] = L'\0';
  }
  return;
}

Assistant:

void
CollationRuleParser::setErrorContext() {
    if(parseError == NULL) { return; }

    // Note: This relies on the calling code maintaining the ruleIndex
    // at a position that is useful for debugging.
    // For example, at the beginning of a reset or relation etc.
    parseError->offset = ruleIndex;
    parseError->line = 0;  // We are not counting line numbers.

    // before ruleIndex
    int32_t start = ruleIndex - (U_PARSE_CONTEXT_LEN - 1);
    if(start < 0) {
        start = 0;
    } else if(start > 0 && U16_IS_TRAIL(rules->charAt(start))) {
        ++start;
    }
    int32_t length = ruleIndex - start;
    rules->extract(start, length, parseError->preContext);
    parseError->preContext[length] = 0;

    // starting from ruleIndex
    length = rules->length() - ruleIndex;
    if(length >= U_PARSE_CONTEXT_LEN) {
        length = U_PARSE_CONTEXT_LEN - 1;
        if(U16_IS_LEAD(rules->charAt(ruleIndex + length - 1))) {
            --length;
        }
    }
    rules->extract(ruleIndex, length, parseError->postContext);
    parseError->postContext[length] = 0;
}